

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O3

uint64_t recip_sqrt_estimate(int *exp,int exp_off,uint64_t frac)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = *exp;
  if (uVar2 == 0) {
    uVar2 = 0;
    if ((frac & 0x8000000000000) == 0) {
      lVar1 = 0x3f;
      if ((frac & 0x7ffffffffffff) != 0) {
        for (; (frac & 0x7ffffffffffff) >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      frac = frac << (~(byte)lVar1 + 0x34 & 0x3f);
      uVar2 = ((uint)lVar1 ^ 0xffffffc0) + 0xd;
      *exp = uVar2;
    }
    frac = frac * 2;
  }
  iVar3 = (uint)((uVar2 & 1) == 0) * 0x80;
  uVar2 = do_recip_sqrt_estimate
                    (iVar3 + ((uint)(frac >> ((byte)(uVar2 & 1) | 0x2c)) & iVar3 + 0x7fU) + 0x80);
  *exp = (exp_off - *exp) / 2;
  return (ulong)(uVar2 & 0xff) << 0x2c;
}

Assistant:

static uint64_t recip_sqrt_estimate(int *exp , int exp_off, uint64_t frac)
{
    int estimate;
    uint32_t scaled;

    if (*exp == 0) {
        while (extract64(frac, 51, 1) == 0) {
            frac = frac << 1;
            *exp -= 1;
        }
        frac = extract64(frac, 0, 51) << 1;
    }

    if (*exp & 1) {
        /* scaled = UInt('01':fraction<51:45>) */
        scaled = deposit32(1 << 7, 0, 7, extract64(frac, 45, 7));
    } else {
        /* scaled = UInt('1':fraction<51:44>) */
        scaled = deposit32(1 << 8, 0, 8, extract64(frac, 44, 8));
    }
    estimate = do_recip_sqrt_estimate(scaled);

    *exp = (exp_off - *exp) / 2;
    return extract64(estimate, 0, 8) << 44;
}